

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall kj::str<char_const&>(String *__return_storage_ptr__,kj *this,char *params)

{
  kj local_9;
  
  local_9 = *this;
  _::concat<kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_9,(FixedArray<char,_1UL> *)params);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}